

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

lua_Number numarith(lua_State *L,int op,lua_Number v1,lua_Number v2)

{
  lua_State *local_40;
  lua_Number v2_local;
  lua_Number v1_local;
  int op_local;
  lua_State *L_local;
  
  switch(op) {
  case 0:
    L_local = (lua_State *)(v1 + v2);
    break;
  case 1:
    L_local = (lua_State *)(v1 - v2);
    break;
  case 2:
    L_local = (lua_State *)(v1 * v2);
    break;
  case 3:
    L_local = (lua_State *)luaV_modf(L,v1,v2);
    break;
  case 4:
    if ((v2 != 2.0) || (NAN(v2))) {
      local_40 = (lua_State *)pow(v1,v2);
    }
    else {
      local_40 = (lua_State *)(v1 * v1);
    }
    L_local = local_40;
    break;
  case 5:
    L_local = (lua_State *)(v1 / v2);
    break;
  case 6:
    L_local = (lua_State *)floor(v1 / v2);
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 0xc:
    L_local = (lua_State *)((ulong)v1 ^ 0x8000000000000000);
  }
  return (lua_Number)L_local;
}

Assistant:

static lua_Number numarith (lua_State *L, int op, lua_Number v1,
                                                  lua_Number v2) {
  switch (op) {
    case LUA_OPADD: return luai_numadd(L, v1, v2);
    case LUA_OPSUB: return luai_numsub(L, v1, v2);
    case LUA_OPMUL: return luai_nummul(L, v1, v2);
    case LUA_OPDIV: return luai_numdiv(L, v1, v2);
    case LUA_OPPOW: return luai_numpow(L, v1, v2);
    case LUA_OPIDIV: return luai_numidiv(L, v1, v2);
    case LUA_OPUNM: return luai_numunm(L, v1);
    case LUA_OPMOD: return luaV_modf(L, v1, v2);
    default: lua_assert(0); return 0;
  }
}